

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

Matrix * rw::Matrix::invertGeneral(Matrix *dst,Matrix *src)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar11 = (float)(src->up).y;
  fVar2 = (float)(src->up).z;
  fVar3 = (float)(src->right).z;
  fVar14 = (float)(src->up).x;
  fVar13 = (float)(src->at).x;
  uVar4 = (src->at).y;
  uVar5 = (src->at).z;
  fVar8 = fVar11 * (float)uVar5 - (float)uVar4 * fVar2;
  fVar9 = fVar3 * (float)uVar4 - (float)(src->right).y * (float)uVar5;
  (dst->right).x = (float32)fVar8;
  (dst->right).y = (float32)fVar9;
  fVar10 = (float)(src->right).y * fVar2 - fVar11 * fVar3;
  fVar11 = (float)(src->right).x * fVar8 + fVar9 * fVar14 + fVar10 * fVar13;
  uVar7 = -(uint)(fVar11 != 0.0);
  fVar6 = (float)(~uVar7 & 0x3f800000 | (uint)(1.0 / fVar11) & uVar7);
  (dst->right).x = (float32)(fVar8 * fVar6);
  (dst->right).y = (float32)(fVar9 * fVar6);
  fVar10 = fVar10 * fVar6;
  (dst->right).z = (float32)fVar10;
  fVar11 = (float)(src->right).x;
  fVar3 = (float)(src->right).z;
  fVar15 = (fVar13 * fVar2 - (float)uVar5 * fVar14) * fVar6;
  fVar16 = (fVar11 * (float)uVar5 - fVar3 * fVar13) * fVar6;
  (dst->up).x = (float32)fVar15;
  (dst->up).y = (float32)fVar16;
  fVar14 = (float)(src->up).x;
  fVar12 = (fVar3 * fVar14 - fVar2 * fVar11) * fVar6;
  (dst->up).z = (float32)fVar12;
  fVar2 = (float)(src->up).y;
  fVar17 = (fVar14 * (float)uVar4 - fVar13 * fVar2) * fVar6;
  (dst->at).x = (float32)fVar17;
  fVar3 = (float)(src->right).y;
  fVar13 = ((float)(src->at).x * fVar3 - (float)uVar4 * fVar11) * fVar6;
  fVar14 = (fVar2 * fVar11 - fVar3 * fVar14) * fVar6;
  (dst->at).y = (float32)fVar13;
  (dst->at).z = (float32)fVar14;
  fVar11 = (float)(src->pos).y;
  fVar2 = (float)(src->pos).z;
  (dst->pos).x = (float32)-(fVar17 * fVar2 + (float)(src->pos).x * fVar8 * fVar6 + fVar15 * fVar11);
  fVar3 = (float)(src->pos).x;
  (dst->pos).y = (float32)-(fVar2 * fVar13 + fVar9 * fVar6 * fVar3 + fVar16 * fVar11);
  (dst->pos).z = (float32)-(fVar14 * fVar2 + fVar10 * fVar3 + fVar12 * (float)(src->pos).y);
  pbVar1 = (byte *)((long)&dst->flags + 2);
  *pbVar1 = *pbVar1 & 0xfd;
  return dst;
}

Assistant:

Matrix*
Matrix::invertGeneral(Matrix *dst, const Matrix *src)
{
	float32 det, invdet;
	// calculate a few cofactors
	dst->right.x = src->up.y*src->at.z - src->up.z*src->at.y;
	dst->right.y = src->at.y*src->right.z - src->at.z*src->right.y;
	dst->right.z = src->right.y*src->up.z - src->right.z*src->up.y;
	// get the determinant from that
	det = src->up.x * dst->right.y + src->at.x * dst->right.z + dst->right.x * src->right.x;
	invdet = 1.0;
	if(det != 0.0f)
		invdet = 1.0f/det;
	dst->right.x *= invdet;
	dst->right.y *= invdet;
	dst->right.z *= invdet;
	dst->up.x = invdet * (src->up.z*src->at.x - src->up.x*src->at.z);
	dst->up.y = invdet * (src->at.z*src->right.x - src->at.x*src->right.z);
	dst->up.z = invdet * (src->right.z*src->up.x - src->right.x*src->up.z);
	dst->at.x = invdet * (src->up.x*src->at.y - src->up.y*src->at.x);
	dst->at.y = invdet * (src->at.x*src->right.y - src->at.y*src->right.x);
	dst->at.z = invdet * (src->right.x*src->up.y - src->right.y*src->up.x);
	dst->pos.x = -(src->pos.x*dst->right.x + src->pos.y*dst->up.x + src->pos.z*dst->at.x);
	dst->pos.y = -(src->pos.x*dst->right.y + src->pos.y*dst->up.y + src->pos.z*dst->at.y);
	dst->pos.z = -(src->pos.x*dst->right.z + src->pos.y*dst->up.z + src->pos.z*dst->at.z);
	dst->flags &= ~IDENTITY;
	return dst;
}